

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cpu_indexed_indirect_instructions.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_13ef60::CpuIndexedIndirectTest_sbc_handles_wraparound_Test::
~CpuIndexedIndirectTest_sbc_handles_wraparound_Test
          (CpuIndexedIndirectTest_sbc_handles_wraparound_Test *this)

{
  n_e_s::core::test::CpuTest::~CpuTest((CpuTest *)this);
  operator_delete(this,0x118);
  return;
}

Assistant:

TEST_F(CpuIndexedIndirectTest, sbc_handles_wraparound) {
    registers.a = 0xD0;
    registers.p = C_FLAG;
    expected.a = 0xE0;
    expected.p = N_FLAG;
    memory_content = 0xF0;

    run_instruction_with_wraparound(SBC_INXIND);
}